

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.h
# Opt level: O0

CornerIndex __thiscall draco::CornerTable::SwingLeft(CornerTable *this,CornerIndex corner)

{
  CornerIndex CVar1;
  CornerIndex CVar2;
  CornerTable *in_RDI;
  CornerIndex in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  CornerIndex corner_00;
  CornerTable *pCVar3;
  
  pCVar3 = in_RDI;
  CVar1 = Next((CornerTable *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               (uint)in_RDI);
  corner_00.value_ = (uint)pCVar3;
  CVar2 = Opposite(in_RDI,in_stack_ffffffffffffffe0);
  CVar1 = Next((CornerTable *)CONCAT44(CVar2.value_,CVar1.value_),corner_00);
  return (CornerIndex)CVar1.value_;
}

Assistant:

inline CornerIndex SwingLeft(CornerIndex corner) const {
    return Next(Opposite(Next(corner)));
  }